

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

void __thiscall
fmt::v7::detail::container_buffer<fmt::v7::detail::buffer<char>_>::grow
          (container_buffer<fmt::v7::detail::buffer<char>_> *this,size_t capacity)

{
  buffer<char> *pbVar1;
  
  pbVar1 = this->container_;
  if (pbVar1->capacity_ < capacity) {
    (**pbVar1->_vptr_buffer)(pbVar1,capacity);
  }
  pbVar1->size_ = capacity;
  (this->super_buffer<char>).ptr_ = this->container_->ptr_;
  (this->super_buffer<char>).capacity_ = capacity;
  return;
}

Assistant:

void grow(size_t capacity) FMT_OVERRIDE {
    container_.resize(capacity);
    this->set(&container_[0], capacity);
  }